

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  Result RVar4;
  TargetType TVar5;
  int iVar6;
  PolicyStatus PVar7;
  long lVar8;
  char *pcVar9;
  cmGeneratorTarget *pcVar10;
  string *psVar11;
  cmValue cVar12;
  cmLinkImplementationLibraries *pcVar13;
  cmLocalGenerator *lg;
  ostream *poVar14;
  char *pcVar15;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *p_Var16;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  cmGeneratorTarget *target;
  string propertyName;
  string local_378;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *local_358;
  string result;
  string targetName;
  string linkedTargetsContent;
  cmGeneratorExpressionDAGChecker dagChecker;
  string interfacePropertyName;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_228;
  string local_218;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1f8;
  ostringstream e;
  string local_70;
  string local_50;
  
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar6 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar6 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  target = (cmGeneratorTarget *)0x0;
  targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
  targetName._M_string_length = 0;
  propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
  propertyName._M_string_length = 0;
  targetName.field_2._M_local_buf[0] = '\0';
  propertyName.field_2._M_local_buf[0] = '\0';
  lVar8 = (long)(parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar8 == 1) {
    target = context->HeadTarget;
    std::__cxx11::string::_M_assign((string *)&propertyName);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&context->SeenTargetProperties,&propertyName);
    context->HadHeadSensitiveCondition = true;
    if (target == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&e,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dagChecker,
                 "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.   Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
                 ,(allocator<char> *)&local_378);
      reportError(context,(string *)&e,(string *)&dagChecker);
    }
    else {
LAB_0041ec7a:
      bVar2 = std::operator==(&propertyName,"SOURCES");
      if (bVar2) {
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_unique<cmGeneratorTarget_const*const&>
                  ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    *)&context->SourceSensitiveTargets,&target);
      }
      if (propertyName._M_string_length == 0) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&e,content);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&dagChecker,
                   "$<TARGET_PROPERTY:...> expression requires a non-empty property name.",
                   (allocator<char> *)&local_378);
        reportError(context,(string *)&e,(string *)&dagChecker);
      }
      else {
        bVar2 = cmsys::RegularExpression::find
                          (&Evaluate::propertyNameValidator,propertyName._M_dataplus._M_p);
        if (bVar2) {
          if (target == (cmGeneratorTarget *)0x0) {
            __assert_fail("target",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                          ,0x7ed,
                          "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                         );
          }
          bVar2 = std::operator==(&propertyName,"LINKER_LANGUAGE");
          if (!bVar2) {
            interfacePropertyName._M_dataplus._M_p = (pointer)&interfacePropertyName.field_2;
            interfacePropertyName._M_string_length = 0;
            interfacePropertyName.field_2._M_local_buf[0] = '\0';
            bVar2 = std::operator==(&propertyName,"INCLUDE_DIRECTORIES");
            if (bVar2) {
LAB_0041efe9:
              std::__cxx11::string::assign((char *)&interfacePropertyName);
LAB_0041eff6:
              bVar2 = false;
            }
            else {
              bVar2 = std::operator==(&propertyName,"INTERFACE_INCLUDE_DIRECTORIES");
              if (!bVar2) {
                bVar2 = std::operator==(&propertyName,"SYSTEM_INCLUDE_DIRECTORIES");
                if (bVar2) goto LAB_0041efe9;
                bVar2 = std::operator==(&propertyName,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
                if (bVar2) goto LAB_0041f059;
                bVar2 = std::operator==(&propertyName,"COMPILE_DEFINITIONS");
                if (bVar2) goto LAB_0041efe9;
                bVar2 = std::operator==(&propertyName,"INTERFACE_COMPILE_DEFINITIONS");
                if (bVar2) goto LAB_0041f059;
                bVar2 = std::operator==(&propertyName,"COMPILE_OPTIONS");
                if (bVar2) goto LAB_0041efe9;
                bVar2 = std::operator==(&propertyName,"INTERFACE_COMPILE_OPTIONS");
                if (bVar2) goto LAB_0041f059;
                bVar2 = std::operator==(&propertyName,"AUTOUIC_OPTIONS");
                if (bVar2) goto LAB_0041efe9;
                bVar2 = std::operator==(&propertyName,"INTERFACE_AUTOUIC_OPTIONS");
                if (bVar2) goto LAB_0041f059;
                bVar2 = std::operator==(&propertyName,"SOURCES");
                if (bVar2) goto LAB_0041efe9;
                bVar2 = std::operator==(&propertyName,"INTERFACE_SOURCES");
                if (bVar2) goto LAB_0041f059;
                bVar2 = std::operator==(&propertyName,"COMPILE_FEATURES");
                if (bVar2) goto LAB_0041efe9;
                bVar2 = std::operator==(&propertyName,"INTERFACE_COMPILE_FEATURES");
                if (bVar2) goto LAB_0041f059;
                bVar2 = std::operator==(&propertyName,"LINK_OPTIONS");
                if (bVar2) goto LAB_0041efe9;
                bVar2 = std::operator==(&propertyName,"INTERFACE_LINK_OPTIONS");
                if (bVar2) goto LAB_0041f059;
                bVar2 = std::operator==(&propertyName,"LINK_DIRECTORIES");
                if (bVar2) goto LAB_0041efe9;
                bVar2 = std::operator==(&propertyName,"INTERFACE_LINK_DIRECTORIES");
                if (bVar2) goto LAB_0041f059;
                bVar2 = std::operator==(&propertyName,"LINK_DEPENDS");
                if (bVar2) goto LAB_0041efe9;
                bVar2 = std::operator==(&propertyName,"INTERFACE_LINK_DEPENDS");
                if (bVar2) goto LAB_0041f059;
                bVar2 = std::operator==(&propertyName,"PRECOMPILE_HEADERS");
                if (bVar2) goto LAB_0041efe9;
                bVar2 = std::operator==(&propertyName,"INTERFACE_PRECOMPILE_HEADERS");
                if (bVar2) goto LAB_0041f059;
                str._M_str = propertyName._M_dataplus._M_p;
                str._M_len = propertyName._M_string_length;
                bVar2 = cmHasLiteralPrefix<21ul>(str,(char (*) [21])"COMPILE_DEFINITIONS_");
                if ((bVar2) &&
                   (PVar7 = cmLocalGenerator::GetPolicyStatus(context->LG,CMP0043), PVar7 < NEW)) {
                  std::__cxx11::string::assign((char *)&interfacePropertyName);
                }
                goto LAB_0041eff6;
              }
LAB_0041f059:
              bVar2 = true;
              std::__cxx11::string::assign((char *)&interfacePropertyName);
            }
            if (((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
                (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression
                                   (dagCheckerParent), bVar3)) ||
               (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(dagCheckerParent),
               bVar3)) {
LAB_0041f08d:
              bVar3 = false;
LAB_0041f08f:
              if (bVar2) {
                cmGeneratorTarget::EvaluateInterfaceProperty
                          ((string *)&e,target,&propertyName,context,dagCheckerParent,Usage);
                cmGeneratorExpression::StripEmptyListElements(__return_storage_ptr__,(string *)&e);
                std::__cxx11::string::~string((string *)&e);
              }
              else {
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr(&local_228,
                               (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                *)context);
                pcVar10 = target;
                std::__cxx11::string::string((string *)&local_70,(string *)&propertyName);
                cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                          (&dagChecker,(cmListFileBacktrace *)&local_228,pcVar10,&local_70,content,
                           dagCheckerParent);
                std::__cxx11::string::~string((string *)&local_70);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_228._M_refcount);
                RVar4 = cmGeneratorExpressionDAGChecker::Check(&dagChecker);
                if (RVar4 == SELF_REFERENCE) {
                  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&e,content)
                  ;
                  cmGeneratorExpressionDAGChecker::ReportError(&dagChecker,context,(string *)&e);
                  std::__cxx11::string::~string((string *)&e);
LAB_0041f548:
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  __return_storage_ptr__->_M_string_length = 0;
                  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                }
                else {
                  if (RVar4 == CYCLIC_REFERENCE) goto LAB_0041f548;
                  result._M_dataplus._M_p = (pointer)&result.field_2;
                  result._M_string_length = 0;
                  result.field_2._M_local_buf[0] = '\0';
                  cVar12 = cmGeneratorTarget::GetProperty(target,&propertyName);
                  if (cVar12.Value == (string *)0x0) {
                    if (bVar3) {
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      __return_storage_ptr__->_M_string_length = 0;
                      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                    }
                    else {
                      bVar2 = cmGeneratorTarget::IsImported(target);
                      if ((bVar2) ||
                         (TVar5 = cmGeneratorTarget::GetType(target), TVar5 == INTERFACE_LIBRARY))
                      goto LAB_0041f19a;
                      psVar11 = &context->Config;
                      bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                                        (target,&propertyName,psVar11);
                      if (bVar2) {
                        context->HadContextSensitiveCondition = true;
                        bVar2 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                                          (target,&propertyName,psVar11);
                        pcVar9 = "0";
                        if (bVar2) {
                          pcVar9 = "1";
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)__return_storage_ptr__,pcVar9,(allocator<char> *)&e);
                      }
                      else {
                        bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                                          (target,&propertyName,psVar11);
                        if (bVar2) {
                          context->HadContextSensitiveCondition = true;
                          pcVar15 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                              (target,&propertyName,psVar11);
                          pcVar9 = "";
                          if (pcVar15 != (char *)0x0) {
                            pcVar9 = pcVar15;
                          }
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)__return_storage_ptr__,pcVar9,(allocator<char> *)&e);
                        }
                        else {
                          bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                            (target,&propertyName,psVar11);
                          if (bVar2) {
                            context->HadContextSensitiveCondition = true;
                            pcVar15 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                                (target,&propertyName,psVar11);
                            pcVar9 = "";
                            if (pcVar15 != (char *)0x0) {
                              pcVar9 = pcVar15;
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)__return_storage_ptr__,pcVar9,(allocator<char> *)&e
                                      );
                          }
                          else {
                            bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                              (target,&propertyName,psVar11);
                            if (!bVar2) goto LAB_0041f19a;
                            context->HadContextSensitiveCondition = true;
                            pcVar15 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                                (target,&propertyName,psVar11);
                            pcVar9 = "";
                            if (pcVar15 != (char *)0x0) {
                              pcVar9 = pcVar15;
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)__return_storage_ptr__,pcVar9,(allocator<char> *)&e
                                      );
                          }
                        }
                      }
                    }
                  }
                  else {
                    std::__cxx11::string::_M_assign((string *)&result);
LAB_0041f19a:
                    bVar2 = cmGeneratorTarget::IsImported(target);
                    if ((dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0 || bVar2) ||
                       (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                          (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY), bVar2)) {
LAB_0041f1c1:
                      if (interfacePropertyName._M_string_length != 0) {
                        cmGeneratorExpressionNode::EvaluateDependentExpression
                                  (&local_378,&result,context->LG,context,target,&dagChecker,target)
                        ;
                        cmGeneratorExpression::StripEmptyListElements((string *)&e,&local_378);
                        std::__cxx11::string::operator=((string *)&result,(string *)&e);
                        std::__cxx11::string::~string((string *)&e);
                        std::__cxx11::string::~string((string *)&local_378);
                        pcVar10 = target;
                        linkedTargetsContent._M_dataplus._M_p =
                             (pointer)&linkedTargetsContent.field_2;
                        linkedTargetsContent._M_string_length = 0;
                        linkedTargetsContent.field_2._M_local_buf[0] = '\0';
                        pcVar13 = cmGeneratorTarget::GetLinkImplementationLibraries
                                            (target,&context->Config,Usage);
                        if (pcVar13 != (cmLinkImplementationLibraries *)0x0) {
                          pcVar1 = (pcVar13->Libraries).
                                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          p_Var16 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                     *)&(((pcVar13->Libraries).
                                          super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_cmLinkItem).Backtrace;
                          while ((pointer)(p_Var16 + -3) != pcVar1) {
                            local_358 = p_Var16;
                            if ((cmGeneratorTarget *)p_Var16[-1]._M_ptr != (cmGeneratorTarget *)0x0)
                            {
                              lg = cmGeneratorTarget::GetLocalGenerator(pcVar10);
                              std::__cxx11::string::string
                                        ((string *)&local_378,(string *)&context->Config);
                              bVar2 = context->Quiet;
                              bVar3 = context->EvaluateForBuildsystem;
                              std::
                              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ::__shared_ptr(&local_1f8,local_358);
                              std::__cxx11::string::string
                                        ((string *)&local_50,(string *)&context->Language);
                              cmGeneratorExpressionContext::cmGeneratorExpressionContext
                                        ((cmGeneratorExpressionContext *)&e,lg,&local_378,bVar2,
                                         pcVar10,pcVar10,bVar3,(cmListFileBacktrace *)&local_1f8,
                                         &local_50);
                              std::__cxx11::string::~string((string *)&local_50);
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                        (&local_1f8._M_refcount);
                              std::__cxx11::string::~string((string *)&local_378);
                              cmGeneratorTarget::EvaluateInterfaceProperty
                                        (&local_218,(cmGeneratorTarget *)local_358[-1]._M_ptr,
                                         &interfacePropertyName,(cmGeneratorExpressionContext *)&e,
                                         &dagChecker,Usage);
                              if (local_218._M_string_length != 0) {
                                if (linkedTargetsContent._M_string_length == 0) {
                                  std::__cxx11::string::operator=
                                            ((string *)&linkedTargetsContent,(string *)&local_218);
                                }
                                else {
                                  std::__cxx11::string::reserve((ulong)&linkedTargetsContent);
                                  std::__cxx11::string::append((char *)&linkedTargetsContent);
                                  std::__cxx11::string::append((string *)&linkedTargetsContent);
                                }
                              }
                              std::__cxx11::string::~string((string *)&local_218);
                              cmGeneratorExpressionContext::~cmGeneratorExpressionContext
                                        ((cmGeneratorExpressionContext *)&e);
                            }
                            p_Var16 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                       *)&local_358[4]._M_refcount;
                          }
                        }
                        if (linkedTargetsContent._M_string_length != 0) {
                          pcVar9 = ";";
                          if (result._M_string_length == 0) {
                            pcVar9 = "";
                          }
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&e,pcVar9,&linkedTargetsContent);
                          std::__cxx11::string::append((string *)&result);
                          std::__cxx11::string::~string((string *)&e);
                        }
                        std::__cxx11::string::~string((string *)&linkedTargetsContent);
                      }
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)result._M_dataplus._M_p == &result.field_2) {
                        (__return_storage_ptr__->field_2)._M_allocated_capacity =
                             CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                      result.field_2._M_local_buf[0]);
                        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                             result.field_2._8_8_;
                      }
                      else {
                        (__return_storage_ptr__->_M_dataplus)._M_p = result._M_dataplus._M_p;
                        (__return_storage_ptr__->field_2)._M_allocated_capacity =
                             CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                                      result.field_2._M_local_buf[0]);
                      }
                      __return_storage_ptr__->_M_string_length = result._M_string_length;
                      result._M_string_length = 0;
                      result.field_2._M_local_buf[0] = '\0';
                      result._M_dataplus._M_p = (pointer)&result.field_2;
                    }
                    else {
                      psVar11 = &context->Config;
                      bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                        (target,&propertyName,psVar11);
                      if (bVar2) {
                        context->HadContextSensitiveCondition = true;
                        pcVar15 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                            (target,&propertyName,psVar11);
                        pcVar9 = "";
                        if (pcVar15 != (char *)0x0) {
                          pcVar9 = pcVar15;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)__return_storage_ptr__,pcVar9,(allocator<char> *)&e);
                      }
                      else {
                        bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                          (target,&propertyName,psVar11);
                        if (!bVar2) goto LAB_0041f1c1;
                        context->HadContextSensitiveCondition = true;
                        pcVar15 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                            (target,&propertyName,psVar11);
                        pcVar9 = "";
                        if (pcVar15 != (char *)0x0) {
                          pcVar9 = pcVar15;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)__return_storage_ptr__,pcVar9,(allocator<char> *)&e);
                      }
                    }
                  }
                  std::__cxx11::string::~string((string *)&result);
                }
                cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&dagChecker);
              }
            }
            else {
              bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY);
              if (!bVar3) {
                bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories
                                  (dagCheckerParent);
                if (((((!bVar3) &&
                      (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                                         (dagCheckerParent), !bVar3)) &&
                     ((bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions
                                         (dagCheckerParent), !bVar3 &&
                      ((bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions
                                          (dagCheckerParent), !bVar3 &&
                       (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions
                                          (dagCheckerParent), !bVar3)))))) &&
                    (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent),
                    !bVar3)) &&
                   ((((bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                         (dagCheckerParent), !bVar3 &&
                      (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions
                                         (dagCheckerParent), !bVar3)) &&
                     (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDirectories
                                        (dagCheckerParent), !bVar3)) &&
                    ((bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends
                                        (dagCheckerParent), !bVar3 &&
                     (bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingPrecompileHeaders
                                        (dagCheckerParent), !bVar3)))))) {
                  __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                ,0x825,
                                "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                               );
                }
                goto LAB_0041f08d;
              }
              if (interfacePropertyName._M_string_length == 0) {
                bVar3 = true;
                goto LAB_0041f08f;
              }
              GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&e,content);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&dagChecker,
                         "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                         ,(allocator<char> *)&local_378);
              reportError(context,(string *)&e,(string *)&dagChecker);
              std::__cxx11::string::~string((string *)&dagChecker);
              std::__cxx11::string::~string((string *)&e);
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              __return_storage_ptr__->_M_string_length = 0;
              (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            }
            std::__cxx11::string::~string((string *)&interfacePropertyName);
            goto LAB_0041ef10;
          }
          bVar2 = cmGeneratorTarget::LinkLanguagePropagatesToDependents(target);
          if ((!bVar2 || dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0) ||
             ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                 (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY), !bVar2 &&
              (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent), !bVar2)
              ))) {
            cmGeneratorTarget::GetLinkerLanguage(__return_storage_ptr__,target,&context->Config);
            goto LAB_0041ef10;
          }
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&e,content);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&dagChecker,
                     "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                     ,(allocator<char> *)&local_378);
          reportError(context,(string *)&e,(string *)&dagChecker);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&e,content);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&dagChecker,"Property name not supported.",
                     (allocator<char> *)&local_378);
          reportError(context,(string *)&e,(string *)&dagChecker);
        }
      }
    }
LAB_0041eee6:
    std::__cxx11::string::~string((string *)&dagChecker);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    if (lVar8 != 2) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&e,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dagChecker,
                 "$<TARGET_PROPERTY:...> expression requires one or two parameters",
                 (allocator<char> *)&local_378);
      reportError(context,(string *)&e,(string *)&dagChecker);
      goto LAB_0041eee6;
    }
    std::__cxx11::string::_M_assign((string *)&targetName);
    std::__cxx11::string::_M_assign((string *)&propertyName);
    pcVar9 = GetErrorText(&targetName,&propertyName);
    if (pcVar9 != (char *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&e,content);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dagChecker,pcVar9,(allocator<char> *)&local_378);
      reportError(context,(string *)&e,(string *)&dagChecker);
      goto LAB_0041eee6;
    }
    __x._M_str = propertyName._M_dataplus._M_p;
    __x._M_len = propertyName._M_string_length;
    __y._M_str = "ALIASED_TARGET";
    __y._M_len = 0xe;
    bVar2 = std::operator==(__x,__y);
    if (bVar2) {
      bVar2 = cmMakefile::IsAlias(context->LG->Makefile,&targetName);
      if ((bVar2) &&
         (pcVar10 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&targetName),
         pcVar10 != (cmGeneratorTarget *)0x0)) {
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar10);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar11);
        goto LAB_0041ef10;
      }
    }
    else {
      __x_00._M_str = propertyName._M_dataplus._M_p;
      __x_00._M_len = propertyName._M_string_length;
      __y_00._M_str = "ALIAS_GLOBAL";
      __y_00._M_len = 0xc;
      bVar2 = std::operator==(__x_00,__y_00);
      if (!bVar2) {
        target = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&targetName);
        if (target == (cmGeneratorTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar14 = std::operator<<((ostream *)&e,"Target \"");
          poVar14 = std::operator<<(poVar14,(string *)&targetName);
          std::operator<<(poVar14,"\" not found.");
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    ((string *)&dagChecker,content);
          std::__cxx11::stringbuf::str();
          reportError(context,(string *)&dagChecker,&local_378);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::~string((string *)&dagChecker);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          goto LAB_0041ef10;
        }
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_unique<cmGeneratorTarget_const*const&>
                  ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    *)&context->AllTargets,&target);
        goto LAB_0041ec7a;
      }
      bVar2 = cmMakefile::IsAlias(context->LG->Makefile,&targetName);
      if (bVar2) {
        bVar2 = cmGlobalGenerator::IsAlias(context->LG->GlobalGenerator,&targetName);
        pcVar9 = "FALSE";
        if (bVar2) {
          pcVar9 = "TRUE";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar9,(allocator<char> *)&e);
        goto LAB_0041ef10;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0041ef10:
  std::__cxx11::string::~string((string *)&propertyName);
  std::__cxx11::string::~string((string *)&targetName);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = nullptr;
    std::string targetName;
    std::string propertyName;

    if (parameters.size() == 2) {
      targetName = parameters[0];
      propertyName = parameters[1];

      if (const char* e = GetErrorText(targetName, propertyName)) {
        reportError(context, content->GetOriginalExpression(), e);
        return std::string();
      }
      if (propertyName == "ALIASED_TARGET"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return std::string();
      }
      if (propertyName == "ALIAS_GLOBAL"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          return context->LG->GetGlobalGenerator()->IsAlias(targetName)
            ? "TRUE"
            : "FALSE";
        }
        return std::string();
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);

    } else if (parameters.size() == 1) {
      target = context->HeadTarget;
      propertyName = parameters[0];

      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);

      context->HadHeadSensitiveCondition = true;
      if (!target) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
          "It may not be used with add_custom_command or add_custom_target.  "
          " "
          "Specify the target to read a property from using the "
          "$<TARGET_PROPERTY:tgt,prop> signature instead.");
        return std::string();
      }
    } else {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }

    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME

    bool evaluatingLinkLibraries = false;

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
        evaluatingLinkLibraries = true;
        if (!interfacePropertyName.empty()) {
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||
        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    if (isInterfaceProperty) {
      return cmGeneratorExpression::StripEmptyListElements(
        target->EvaluateInterfaceProperty(propertyName, context,
                                          dagCheckerParent));
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        // We handle transitive properties above.  For non-transitive
        // properties we accept repeats anyway.
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    std::string result;
    bool haveProp = false;
    if (cmValue p = target->GetProperty(propertyName)) {
      result = *p;
      haveProp = true;
    } else if (evaluatingLinkLibraries) {
      return std::string();
    }

    if (!haveProp && !target->IsImported() &&
        target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }

    if (!interfacePropertyName.empty()) {
      result = cmGeneratorExpression::StripEmptyListElements(
        this->EvaluateDependentExpression(result, context->LG, context, target,
                                          &dagChecker, target));
      std::string linkedTargetsContent = getLinkedTargetsContent(
        target, interfacePropertyName, context, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
    }
    return result;
  }